

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.h
# Opt level: O0

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmResourceInfoCommon::GetPlanarAuxOffset
          (GmmResourceInfoCommon *this,uint32_t ArrayIndex,GMM_UNIFIED_AUX_TYPE GmmAuxType)

{
  int iVar1;
  undefined4 extraout_var;
  SKU_FEATURE_TABLE *pSVar2;
  GMM_GFX_SIZE_T local_20;
  GMM_GFX_SIZE_T Offset;
  GMM_UNIFIED_AUX_TYPE GmmAuxType_local;
  uint32_t ArrayIndex_local;
  GmmResourceInfoCommon *this_local;
  
  local_20 = 0;
  if (((ulong)(this->Surf).Flags.Gpu >> 0x25 & 1) != 0) {
    iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
    pSVar2 = Context::GetSkuTable((Context *)CONCAT44(extraout_var,iVar1));
    if (((ulong)pSVar2->field_1 >> 0x19 & 1) == 0) {
      if (GmmAuxType == GMM_AUX_Y_CCS) {
        local_20 = (this->Surf).Size;
      }
      else if (GmmAuxType == GMM_AUX_UV_CCS) {
        local_20 = (this->Surf).Size +
                   (this->AuxSurf).Pitch *
                   (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[6];
        if ((((ulong)(this->Surf).Flags.Gpu >> 1 & 1) == 0) ||
           (((ulong)(this->AuxSurf).Flags.Gpu >> 0x2b & 1) == 0)) {
          if ((((ulong)(this->Surf).Flags.Gpu >> 0x10 & 1) != 0) &&
             (((ulong)(this->AuxSurf).Flags.Gpu >> 0x2b & 1) != 0)) {
            local_20 = (this->Surf).Size +
                       (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[1];
          }
        }
        else {
          local_20 = (this->Surf).Size +
                     (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[2];
        }
      }
      else if (GmmAuxType == GMM_AUX_COMP_STATE) {
        local_20 = (this->Surf).Size +
                   (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[1] +
                   (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[2];
      }
      return (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Mip0SlicePitch *
             (ulong)ArrayIndex + local_20;
    }
  }
  return 0;
}

Assistant:

GMM_INLINE_VIRTUAL GMM_INLINE_EXPORTED GMM_GFX_SIZE_T GMM_STDCALL GetPlanarAuxOffset(uint32_t ArrayIndex, GMM_UNIFIED_AUX_TYPE GmmAuxType)
            {
                GMM_GFX_SIZE_T Offset = 0;

                __GMM_ASSERT(ArrayIndex < Surf.ArraySize);
                __GMM_ASSERT(GMM_IS_PLANAR(Surf.Format));

                if (Surf.Flags.Gpu.UnifiedAuxSurface  &&
                    !(GetGmmLibContext()->GetSkuTable().FtrFlatPhysCCS))
                {
                    if (GmmAuxType == GMM_AUX_Y_CCS)
                    {
                        Offset = Surf.Size;
                    }
                    else if (GmmAuxType == GMM_AUX_UV_CCS)
                    {
                        Offset = Surf.Size + (AuxSurf.Pitch * AuxSurf.OffsetInfo.Plane.Y[GMM_PLANE_U]); //Aux Offset in HwLayout

                        if (Surf.Flags.Gpu.CCS && AuxSurf.Flags.Gpu.__NonMsaaLinearCCS)
                        {
                            Offset = Surf.Size + AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_U];
                        }
                        else if (Surf.Flags.Gpu.MMC && AuxSurf.Flags.Gpu.__NonMsaaLinearCCS )
                        {
                            Offset = Surf.Size + AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_Y];
                        }
                    }
                    else if (GmmAuxType == GMM_AUX_COMP_STATE)
                    {
                        Offset = Surf.Size + AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_Y] + AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_U];
                    }

                    Offset += AuxSurf.OffsetInfo.Plane.ArrayQPitch * ArrayIndex;
                }
                else
                {
                    Offset = 0;
                }

                return Offset;
            }